

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

Type * slang::ast::FixedSizeUnpackedArrayType::fromDim
                 (Scope *scope,Type *elementType,ConstantRange dim,DeferredSourceRange sourceRange)

{
  Compilation *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  bool bVar6;
  int iVar7;
  uint64_t uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  SourceRange sourceRange_00;
  ConstantRange local_58;
  ulong local_50;
  undefined1 local_48;
  ulong local_40;
  undefined1 local_38;
  
  local_58 = dim;
  bVar6 = Type::isError(elementType);
  if (!bVar6) {
    iVar10 = dim.left;
    iVar7 = dim.right;
    this = scope->compilation;
    iVar5 = iVar10 - iVar7;
    if (iVar10 - iVar7 == 0 || iVar10 < iVar7) {
      iVar5 = -(iVar10 - iVar7);
    }
    uVar8 = Type::getSelectableWidth(elementType);
    uVar11 = CONCAT44(0,iVar5 + 1);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar11;
    uVar9 = SUB168(auVar1 * auVar3,0);
    bVar6 = SUB168(auVar1 * auVar3,8) != 0;
    local_38 = !bVar6;
    local_40 = uVar9;
    uVar8 = Type::getBitstreamWidth(elementType);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar11;
    local_50 = SUB168(auVar2 * auVar4,0);
    local_48 = SUB168(auVar2 * auVar4,8) == 0;
    if ((bVar6) || ((!(bool)local_48 || 0x3fffffff8 < local_50) || 0x3fffffff8 < uVar9)) {
      sourceRange_00 = slang::syntax::DeferredSourceRange::get(&sourceRange);
      Scope::addDiag(scope,(DiagCode)0x180009,sourceRange_00);
      elementType = this->errorType;
    }
    else {
      elementType = &BumpAllocator::
                     emplace<slang::ast::FixedSizeUnpackedArrayType,slang::ast::Type_const&,slang::ConstantRange&,unsigned_long&,unsigned_long&>
                               (&this->super_BumpAllocator,elementType,&local_58,&local_40,&local_50
                               )->super_Type;
      if ((SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe) != (SyntaxNode *)0x0) {
        (((FixedSizeUnpackedArrayType *)elementType)->super_Type).super_Symbol.originatingSyntax =
             (SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe);
      }
    }
  }
  return &((FixedSizeUnpackedArrayType *)elementType)->super_Type;
}

Assistant:

const Type& FixedSizeUnpackedArrayType::fromDim(const Scope& scope, const Type& elementType,
                                                ConstantRange dim,
                                                DeferredSourceRange sourceRange) {
    if (elementType.isError())
        return elementType;

    auto& comp = scope.getCompilation();
    auto selectableWidth = checkedMulU64(elementType.getSelectableWidth(), dim.width());
    auto bitstreamWidth = checkedMulU64(elementType.getBitstreamWidth(), dim.width());

    if (!selectableWidth || selectableWidth > MaxBitWidth || !bitstreamWidth ||
        bitstreamWidth > MaxBitWidth) {
        scope.addDiag(diag::ObjectTooLarge, sourceRange.get());
        return comp.getErrorType();
    }

    auto result = comp.emplace<FixedSizeUnpackedArrayType>(elementType, dim, *selectableWidth,
                                                           *bitstreamWidth);
    if (auto syntax = sourceRange.syntax())
        result->setSyntax(*syntax);

    return *result;
}